

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

int io_file_write(lua_State *L,IOFileUD *iof,int start)

{
  FILE *__s;
  int iVar1;
  ulong in_RAX;
  char *__ptr;
  size_t sVar2;
  cTValue *o;
  uint stat;
  cTValue *pcVar3;
  ulong uStack_38;
  MSize len;
  
  __s = (FILE *)iof->fp;
  o = L->base + (uint)start;
  stat = 1;
  pcVar3 = o;
  uStack_38 = in_RAX;
  while( true ) {
    if (L->top <= o) {
      iVar1 = luaL_fileresult(L,stat,(char *)0x0);
      return iVar1;
    }
    __ptr = lj_strfmt_wstrnum(L,o,&len);
    if (__ptr == (char *)0x0) break;
    if (stat == 0) {
      stat = 0;
    }
    else {
      sVar2 = fwrite(__ptr,1,uStack_38 >> 0x20,__s);
      stat = (uint)(sVar2 == uStack_38 >> 0x20);
    }
    o = o + 1;
    pcVar3 = pcVar3 + 1;
  }
  lj_err_argt(L,(int)((ulong)((long)pcVar3 - (long)L->base) >> 3) + 1,4);
}

Assistant:

static int io_file_write(lua_State *L, IOFileUD *iof, int start)
{
  FILE *fp = iof->fp;
  cTValue *tv;
  int status = 1;
  for (tv = L->base+start; tv < L->top; tv++) {
    MSize len;
    const char *p = lj_strfmt_wstrnum(L, tv, &len);
    if (!p)
      lj_err_argt(L, (int)(tv - L->base) + 1, LUA_TSTRING);
    status = status && (fwrite(p, 1, len, fp) == len);
  }
  if (LJ_52 && status) {
    L->top = L->base+1;
    if (start == 0)
      setudataV(L, L->base, IOSTDF_UD(L, GCROOT_IO_OUTPUT));
    return 1;
  }
  return luaL_fileresult(L, status, NULL);
}